

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_var_to_local.cpp
# Opt level: O1

void __thiscall
optimization::global_var_to_local::Global_Var_to_Local::optimize_mir
          (Global_Var_to_Local *this,MirPackage *mir,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint32_t uVar3;
  size_t __n;
  pair<int,_int> pair;
  pair<int,_int> pair_00;
  bool bVar4;
  size_type sVar5;
  _Alloc_hider this_00;
  Displayable DVar6;
  _Base_ptr *this_01;
  int iVar7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  const_iterator cVar10;
  mapped_type *pmVar11;
  variant_alternative_t<1UL,_variant<VarId,_basic_string<char>_>_> *pvVar12;
  long *plVar13;
  long lVar14;
  ostream *poVar15;
  mapped_type *pmVar16;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *puVar17;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar18;
  mapped_type *pmVar19;
  Inst *pIVar20;
  Inst *pIVar21;
  mapped_type *pmVar22;
  undefined8 uVar23;
  Inst *pIVar24;
  _Rb_tree_node_base *this_02;
  ulong uVar25;
  pair<int,_int> *ppVar26;
  pair<int,_int> *ppVar27;
  long *plVar28;
  Var_Replace vp;
  VarId var;
  VarId val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  VarId dest;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  global_vars;
  string local_258;
  undefined1 local_238 [8];
  _Alloc_hider _Stack_230;
  undefined1 local_228 [24];
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Base_ptr local_1f0;
  bool local_1e8;
  Displayable local_1d0;
  _Base_ptr local_1c8;
  undefined8 *local_1c0;
  uint32_t local_1b8;
  int local_1ac;
  mapped_type *local_1a8;
  Displayable local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined1 local_178 [8];
  variant<int,_mir::inst::VarId> local_170;
  undefined1 local_150;
  _func_int **local_148;
  long *local_140;
  size_t local_138;
  long local_130 [2];
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *local_120;
  Variable local_118;
  key_type local_f8;
  undefined **local_e8;
  _Base_ptr *local_e0;
  _Rb_tree_node_base *local_d8;
  pair<int,_int> *local_d0;
  _func_int **local_c8;
  undefined **local_c0;
  Timestamp local_b8;
  VarId local_a0;
  VarId local_90;
  VarId local_80;
  VarId local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var8 = (mir->global_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(mir->global_values)._M_t._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    do {
      if (*(char *)&p_Var8[3]._M_parent == '\0') {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var8 + 1)
                  );
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  }
  p_Var1 = &(mir->functions)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var9 = (mir->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != p_Var1;
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
    if (*(char *)&p_Var9[3]._M_parent[1]._M_left == '\0') {
      this_02 = p_Var9 + 1;
      iVar7 = std::__cxx11::string::compare((char *)this_02);
      if ((iVar7 != 0) && (iVar7 = std::__cxx11::string::compare((char *)this_02), iVar7 != 0)) {
        optimize_func((Global_Var_to_Local *)this_02,(MirFunction *)(p_Var9 + 2),
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_60);
      }
    }
  }
  local_238 = (undefined1  [8])local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"$$5_main","");
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
           ::find(&(mir->functions)._M_t,(key_type *)local_238);
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238,local_228._0_8_ + 1);
  }
  if ((_Rb_tree_header *)cVar10._M_node != p_Var1) {
    local_238 = (undefined1  [8])local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"$$5_main","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
              ::at(&mir->functions,(key_type *)local_238);
    if (local_238 != (undefined1  [8])local_228) {
      operator_delete((void *)local_238,local_228._0_8_ + 1);
    }
    if ((pmVar11->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      local_1c8 = (pmVar11->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_f8.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
      local_f8.id = 0xffffffff;
      local_1a8 = pmVar11;
      if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_60._M_impl.super__Rb_tree_header) {
        local_e0 = &local_1c8[3]._M_parent;
        local_120 = &pmVar11->variables;
        local_148 = (_func_int **)&PTR_display_001eff98;
        local_e8 = &PTR_display_001f01f8;
        local_1d0._vptr_Displayable = (_func_int **)&PTR_display_001effc8;
        local_c8 = (_func_int **)&PTR_display_001f0318;
        local_1a0._vptr_Displayable = (_func_int **)&PTR_display_001f0018;
        local_c0 = &PTR_display_001f0198;
        p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          local_140 = local_130;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,*(size_t *)(p_Var9 + 1),
                     (long)&(p_Var9[1]._M_parent)->_M_color + *(size_t *)(p_Var9 + 1));
          p_Var8 = local_1c8[3]._M_parent;
          if (local_1c8[3]._M_left == p_Var8) {
            local_1ac = 1;
            uVar25 = 0;
          }
          else {
            uVar25 = 0;
            do {
              plVar13 = *(long **)(&p_Var8->_M_color + uVar25 * 2);
              iVar7 = (**(code **)(*plVar13 + 8))(plVar13);
              if (iVar7 == 2) {
                plVar28 = (long *)0x0;
                if ((undefined **)*plVar13 != local_c0) {
                  plVar13 = plVar28;
                }
                bVar4 = true;
                if ((char)plVar13[7] == '\x01') {
                  pvVar12 = std::get<1ul,mir::inst::VarId,std::__cxx11::string>
                                      ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)(plVar13 + 3));
                  __n = pvVar12->_M_string_length;
                  if ((__n == local_138) &&
                     ((__n == 0 ||
                      (iVar7 = bcmp((pvVar12->_M_dataplus)._M_p,local_140,__n), iVar7 == 0)))) {
                    local_f8.id = *(uint32_t *)(plVar13 + 2);
                    plVar28 = (long *)&DAT_00000008;
                    bVar4 = false;
                  }
                }
                iVar7 = (int)plVar28;
                if (bVar4) goto LAB_00158b19;
              }
              else {
LAB_00158b19:
                iVar7 = 0;
              }
              if (iVar7 != 0) break;
              uVar25 = uVar25 + 1;
              p_Var8 = local_1c8[3]._M_parent;
            } while (uVar25 < (ulong)((long)local_1c8[3]._M_left - (long)p_Var8 >> 3));
            local_1ac = (int)uVar25 + 1;
          }
          if ((long)local_1c8[3]._M_left - (long)local_1c8[3]._M_parent >> 3 != uVar25) {
            ::mir::types::new_int_ty();
            this_00._M_p = _Stack_230._M_p;
            local_118.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_238;
            local_238 = (undefined1  [8])0x0;
            _Stack_230._M_p = (pointer)0x0;
            local_118.super_Displayable._vptr_Displayable = local_148;
            local_118.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_p;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_p !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(this_00._M_p + 8) = *(int *)(this_00._M_p + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(this_00._M_p + 8) = *(int *)(this_00._M_p + 8) + 1;
              }
            }
            local_118.is_memory_var = false;
            local_118.is_temp_var = false;
            local_118.is_phi_var = false;
            local_118.priority = 0;
            get_new_id((global_var_to_local *)&local_1c0,local_1a8,&local_118);
            local_118.super_Displayable._vptr_Displayable = local_148;
            if (local_118.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_118.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_p !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_p);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_230._M_p !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_230._M_p);
            }
            if (*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) ==
                0) {
              plVar13 = (long *)0x0;
            }
            else {
              plVar13 = (long *)__dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                                        *(long *)(std::clog + -0x18)),
                                               &std::streambuf::typeinfo,&AixLog::Log::typeinfo);
            }
            if (plVar13 == (long *)0x0) {
              _Stack_230._M_p = (pointer)0x5;
              local_228._0_6_ = 0x6563617254;
              local_238 = (undefined1  [8])local_228;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,local_228,5);
              if (local_238 != (undefined1  [8])local_228) {
                operator_delete((void *)local_238,local_228._0_8_ + 1);
              }
            }
            else {
              iVar7 = pthread_mutex_lock((pthread_mutex_t *)(plVar13 + 0x29));
              if (iVar7 != 0) goto LAB_001597e2;
              if ((char)plVar13[0x10] != '\0') {
                (**(code **)(*plVar13 + 0x30))(plVar13);
                *(undefined1 *)(plVar13 + 0x10) = 0;
                plVar13[0x23] = 0;
                *(undefined1 *)(plVar13 + 0x24) = 1;
                local_238 = (undefined1  [8])&PTR__Tag_001edee0;
                local_228._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
                local_210._M_p._0_1_ = 1;
                _Stack_230._M_p = (pointer)(local_228 + 8);
                std::__cxx11::string::_M_assign((string *)(plVar13 + 0x12));
                *(undefined1 *)(plVar13 + 0x16) = local_210._M_p._0_1_;
                local_238 = (undefined1  [8])&PTR__Tag_001edee0;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_230._M_p !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_228 + 8)) {
                  operator_delete(_Stack_230._M_p,local_228._8_8_ + 1);
                }
                AixLog::Function::Function((Function *)local_238,(nullptr_t)0x0);
                std::__cxx11::string::_M_assign((string *)(plVar13 + 0x18));
                std::__cxx11::string::_M_assign((string *)(plVar13 + 0x1c));
                *(bool *)(plVar13 + 0x21) = local_1e8;
                plVar13[0x20] = (long)local_1f0;
                AixLog::Function::~Function((Function *)local_238);
                *(undefined1 *)(plVar13 + 0x25) = 1;
              }
              pthread_mutex_unlock((pthread_mutex_t *)(plVar13 + 0x29));
            }
            local_178 = (undefined1  [8])&PTR__Tag_001edee0;
            local_170.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ =
                 &local_170.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
            local_170.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ = 0;
            local_170.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_index = '\0';
            local_150 = 1;
            if (*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) ==
                0) {
              lVar14 = 0;
            }
            else {
              lVar14 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                               *(long *)(std::clog + -0x18)),
                                      &std::streambuf::typeinfo,&AixLog::Log::typeinfo,0);
            }
            if (lVar14 == 0) {
LAB_00158ea2:
              local_b8.time_point.__d.__r = (duration)std::chrono::_V2::system_clock::now();
              local_b8._vptr_Timestamp = (_func_int **)&PTR__Timestamp_001edeb0;
              local_b8.is_null_ = false;
              if (*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18))
                  == 0) {
                lVar14 = 0;
              }
              else {
                lVar14 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                                 *(long *)(std::clog + -0x18)),
                                        &std::streambuf::typeinfo,&AixLog::Log::typeinfo,0);
              }
              if (lVar14 == 0) {
                local_198 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x15;
                local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                local_258._M_dataplus._M_p =
                     (pointer)std::__cxx11::string::_M_create((ulong *)&local_258,(ulong)&local_198)
                ;
                local_258.field_2._M_allocated_capacity = (size_type)local_198;
                builtin_strncpy(local_258._M_dataplus._M_p,"%Y-%m-%d %H-%M-%S.#ms",0x15);
                local_258._M_string_length = (size_type)local_198;
                local_258._M_dataplus._M_p[(long)local_198] = '\0';
                AixLog::Timestamp::to_string((string *)local_238,&local_b8,&local_258);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::clog,(char *)local_238,(long)_Stack_230._M_p);
                if (local_238 != (undefined1  [8])local_228) {
                  operator_delete((void *)local_238,local_228._0_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._M_dataplus._M_p != &local_258.field_2) {
                  operator_delete(local_258._M_dataplus._M_p,
                                  local_258.field_2._M_allocated_capacity + 1);
                }
LAB_00159006:
                local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_258,"optimize_mir","");
                local_198 = &local_188;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_198,
                           "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/global_var_to_local.cpp"
                           ,"");
                sVar5 = local_258._M_string_length;
                local_238 = (undefined1  [8])&PTR__Function_001edf10;
                _Stack_230._M_p = local_228 + 8;
                paVar2 = &local_258.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._M_dataplus._M_p == paVar2) {
                  local_228._16_4_ = local_258.field_2._8_4_;
                  local_228._20_4_ = local_258.field_2._12_4_;
                }
                else {
                  _Stack_230._M_p = local_258._M_dataplus._M_p;
                }
                local_228._8_8_ = local_258.field_2._M_allocated_capacity;
                local_228._0_8_ = local_258._M_string_length;
                local_258._M_string_length = 0;
                local_258.field_2._M_allocated_capacity =
                     local_258.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_210._M_p = (pointer)&local_200;
                if (local_198 == &local_188) {
                  local_200._8_4_ = local_188._8_4_;
                  local_200._12_4_ = local_188._12_4_;
                }
                else {
                  local_210._M_p = (pointer)local_198;
                }
                local_200._M_allocated_capacity._4_4_ = local_188._M_allocated_capacity._4_4_;
                local_200._M_allocated_capacity._0_4_ = local_188._M_allocated_capacity._0_4_;
                local_208 = local_190;
                local_190 = 0;
                local_188._M_allocated_capacity._0_4_ =
                     local_188._M_allocated_capacity._0_4_ & 0xffffff00;
                local_1f0 = (_Base_ptr)0x55;
                local_1e8 = false;
                local_258._M_dataplus._M_p = (pointer)paVar2;
                local_198 = &local_188;
                if (*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18))
                    == 0) {
                  lVar14 = 0;
                }
                else {
                  lVar14 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                                   *(long *)(std::clog + -0x18)),
                                          &std::streambuf::typeinfo,&AixLog::Log::typeinfo,0);
                }
                if (lVar14 == 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::clog,_Stack_230._M_p,sVar5);
                }
                else {
                  iVar7 = pthread_mutex_lock((pthread_mutex_t *)(lVar14 + 0x148));
                  if (iVar7 != 0) goto LAB_001597d4;
                  std::__cxx11::string::_M_assign((string *)(lVar14 + 0xc0));
                  std::__cxx11::string::_M_assign((string *)(lVar14 + 0xe0));
                  *(bool *)(lVar14 + 0x108) = local_1e8;
                  *(_Base_ptr *)(lVar14 + 0x100) = local_1f0;
                  pthread_mutex_unlock((pthread_mutex_t *)(lVar14 + 0x148));
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::clog,"convert global var  ",0x14);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::clog,(char *)local_140,local_138);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," to local var ",0xe);
                (*(code *)*local_1c0)(&local_1c0,poVar15);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," in ",4);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar15,(local_1a8->name)._M_dataplus._M_p,
                                     (local_1a8->name)._M_string_length);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
                std::ostream::put((char)poVar15);
                std::ostream::flush();
                AixLog::Function::~Function((Function *)local_238);
                if (local_198 != &local_188) {
                  operator_delete(local_198,
                                  CONCAT44(local_188._M_allocated_capacity._4_4_,
                                           local_188._M_allocated_capacity._0_4_) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._M_dataplus._M_p != &local_258.field_2) {
                  operator_delete(local_258._M_dataplus._M_p,
                                  local_258.field_2._M_allocated_capacity + 1);
                }
                local_178 = (undefined1  [8])&PTR__Tag_001edee0;
                if ((__index_type *)
                    local_170.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ !=
                    &local_170.super__Variant_base<int,_mir::inst::VarId>.
                     super__Move_assign_alias<int,_mir::inst::VarId>.
                     super__Copy_assign_alias<int,_mir::inst::VarId>.
                     super__Move_ctor_alias<int,_mir::inst::VarId>.
                     super__Copy_ctor_alias<int,_mir::inst::VarId>.
                     super__Variant_storage_alias<int,_mir::inst::VarId>._M_index) {
                  operator_delete((void *)local_170.super__Variant_base<int,_mir::inst::VarId>.
                                          super__Move_assign_alias<int,_mir::inst::VarId>.
                                          super__Copy_assign_alias<int,_mir::inst::VarId>.
                                          super__Move_ctor_alias<int,_mir::inst::VarId>.
                                          super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                          super__Variant_storage_alias<int,_mir::inst::VarId>._M_u.
                                          _0_8_,
                                  CONCAT53(local_170.super__Variant_base<int,_mir::inst::VarId>.
                                           super__Move_assign_alias<int,_mir::inst::VarId>.
                                           super__Copy_assign_alias<int,_mir::inst::VarId>.
                                           super__Move_ctor_alias<int,_mir::inst::VarId>.
                                           super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                           super__Variant_storage_alias<int,_mir::inst::VarId>.
                                           _19_5_,CONCAT21(local_170.
                                                                                                                      
                                                  super__Variant_base<int,_mir::inst::VarId>.
                                                  super__Move_assign_alias<int,_mir::inst::VarId>.
                                                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                                                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                                                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                                  super__Variant_storage_alias<int,_mir::inst::VarId>
                                                  ._17_2_,local_170.
                                                          super__Variant_base<int,_mir::inst::VarId>
                                                          .
                                                  super__Move_assign_alias<int,_mir::inst::VarId>.
                                                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                                                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                                                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                                  super__Variant_storage_alias<int,_mir::inst::VarId>
                                                  ._M_index)) + 1);
                }
                this_01 = local_e0;
                p_Var8 = *local_e0;
                local_238 = (undefined1  [8])operator_new(0x38);
                pmVar11 = local_1a8;
                *(undefined ***)((long)local_238 + 8) = &PTR_display_001ee058;
                *(uint32_t *)((long)local_238 + 0x10) = local_1b8;
                *(undefined ***)local_238 = local_e8;
                *(undefined1 *)((long)local_238 + 0x30) = 1;
                *(undefined ***)((long)local_238 + 0x20) = &PTR_display_001ee058;
                *(uint32_t *)((long)local_238 + 0x28) = local_f8.id;
                *(_func_int ***)((long)local_238 + 0x18) = local_1d0._vptr_Displayable;
                *(undefined2 *)((long)local_238 + 0x31) = 1;
                std::
                vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ::_M_insert_rval((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                  *)this_01,
                                 (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                  *)(&p_Var8->_M_parent + uVar25),(value_type *)local_238);
                if (local_238 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_238 + 0x28))();
                }
                var_replace::Var_Replace::Var_Replace((Var_Replace *)local_238,pmVar11);
                local_d8 = p_Var9;
                pmVar16 = std::
                          map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                          ::at((map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                                *)&_Stack_230,&local_f8);
                ppVar26 = (pmVar16->
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                ppVar27 = (pmVar16->
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
                local_d0 = ppVar27;
                if (ppVar26 != ppVar27) {
                  do {
                    if ((ppVar26->first != *(int *)&local_1c8[1]._M_left) ||
                       (ppVar26->second != local_1ac)) {
                      puVar17 = var_replace::Var_Replace::get_usepoint
                                          ((Var_Replace *)local_238,*ppVar26);
                      iVar7 = (*(((puVar17->_M_t).
                                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                                super_Displayable)._vptr_Displayable[1])();
                      pIVar24 = (puVar17->_M_t).
                                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                      if (iVar7 == 4) {
                        if ((pIVar24->super_Displayable)._vptr_Displayable != local_c8) {
                          pIVar24 = (Inst *)0x0;
                        }
                        if (*(char *)&pIVar24[2].super_Displayable._vptr_Displayable != '\0') {
                          pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                              ((variant<int,_mir::inst::VarId> *)&pIVar24[1].dest);
                          pmVar19 = std::
                                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                    ::at(local_120,&pvVar18->id);
                          if (pmVar19->is_phi_var == false) {
                            pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                                ((variant<int,_mir::inst::VarId> *)&pIVar24[1].dest)
                            ;
                            local_178 = (undefined1  [8])&PTR_display_001ee058;
                            local_70.id = pvVar18->id;
                            local_170.super__Variant_base<int,_mir::inst::VarId>.
                            super__Move_assign_alias<int,_mir::inst::VarId>.
                            super__Copy_assign_alias<int,_mir::inst::VarId>.
                            super__Move_ctor_alias<int,_mir::inst::VarId>.
                            super__Copy_ctor_alias<int,_mir::inst::VarId>.
                            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first.
                            _M_storage = (_Uninitialized<int,_true>)local_70.id;
                            local_70.super_Displayable._vptr_Displayable =
                                 (_func_int **)&PTR_display_001ee058;
                            local_80.super_Displayable._vptr_Displayable =
                                 (_func_int **)&PTR_display_001ee058;
                            local_80.id = local_1b8;
                            var_replace::Var_Replace::replace
                                      ((Var_Replace *)local_238,&local_70,&local_80);
                            pIVar20 = (Inst *)operator_new(0x38);
                            (pIVar20->dest).super_Displayable._vptr_Displayable =
                                 (_func_int **)&PTR_display_001ee058;
                            (pIVar20->dest).id = local_1b8;
                            (pIVar20->super_Displayable)._vptr_Displayable =
                                 local_1a0._vptr_Displayable;
                            *(undefined1 *)&pIVar20[2].super_Displayable._vptr_Displayable = 1;
                            pIVar20[1].dest.super_Displayable._vptr_Displayable =
                                 (_func_int **)&PTR_display_001ee058;
                            pIVar20[1].dest.id = local_1b8;
                            pIVar20[1].super_Displayable._vptr_Displayable =
                                 local_1d0._vptr_Displayable;
                            *(undefined2 *)
                             ((long)&pIVar20[2].super_Displayable._vptr_Displayable + 1) = 1;
                            pIVar24 = (puVar17->_M_t).
                                      super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                            (puVar17->_M_t).
                            super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                            .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = pIVar20;
                            if (pIVar24 != (Inst *)0x0) {
                              (*(pIVar24->super_Displayable)._vptr_Displayable[5])();
                            }
                            pmVar22 = std::
                                      map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                                      ::at((map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                                            *)&local_200,(key_type *)local_178);
                            pair_00.first = pmVar22->first;
                            pair_00.second = pmVar22->second;
                            puVar17 = var_replace::Var_Replace::get_usepoint
                                                ((Var_Replace *)local_238,pair_00);
                            goto LAB_00159732;
                          }
                        }
                        pIVar20 = (Inst *)operator_new(0x38);
                        uVar3 = local_1b8;
                        local_170.super__Variant_base<int,_mir::inst::VarId>.
                        super__Move_assign_alias<int,_mir::inst::VarId>.
                        super__Copy_assign_alias<int,_mir::inst::VarId>.
                        super__Move_ctor_alias<int,_mir::inst::VarId>.
                        super__Copy_ctor_alias<int,_mir::inst::VarId>.
                        super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
                             *(__index_type *)&pIVar24[2].super_Displayable._vptr_Displayable;
                        local_258._M_dataplus._M_p = (pointer)&local_170;
                        (*std::__detail::__variant::
                          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                          ::_S_vtable._M_arr
                          [(long)(char)local_170.super__Variant_base<int,_mir::inst::VarId>.
                                       super__Move_assign_alias<int,_mir::inst::VarId>.
                                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index
                           + 1]._M_data)((anon_class_8_1_a78179b7_conflict *)&local_258,
                                         (variant<int,_mir::inst::VarId> *)&pIVar24[1].dest);
                        DVar6._vptr_Displayable = local_1d0._vptr_Displayable;
                        local_178 = (undefined1  [8])local_1d0._vptr_Displayable;
                        local_170.super__Variant_base<int,_mir::inst::VarId>.
                        super__Move_assign_alias<int,_mir::inst::VarId>.
                        super__Copy_assign_alias<int,_mir::inst::VarId>.
                        super__Move_ctor_alias<int,_mir::inst::VarId>.
                        super__Copy_ctor_alias<int,_mir::inst::VarId>.
                        super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
                             *(undefined2 *)
                              ((long)&pIVar24[2].super_Displayable._vptr_Displayable + 1);
                        (pIVar20->dest).super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001ee058;
                        (pIVar20->dest).id = uVar3;
                        (pIVar20->super_Displayable)._vptr_Displayable = local_1a0._vptr_Displayable
                        ;
                        local_258._M_dataplus._M_p = (pointer)&pIVar20[1].dest;
                        *(undefined1 *)&pIVar20[2].super_Displayable._vptr_Displayable = 0xff;
                        *(__index_type *)&pIVar20[2].super_Displayable._vptr_Displayable =
                             local_170.super__Variant_base<int,_mir::inst::VarId>.
                             super__Move_assign_alias<int,_mir::inst::VarId>.
                             super__Copy_assign_alias<int,_mir::inst::VarId>.
                             super__Move_ctor_alias<int,_mir::inst::VarId>.
                             super__Copy_ctor_alias<int,_mir::inst::VarId>.
                             super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
                        (*std::__detail::__variant::
                          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                          ::_S_vtable._M_arr
                          [(long)(char)local_170.super__Variant_base<int,_mir::inst::VarId>.
                                       super__Move_assign_alias<int,_mir::inst::VarId>.
                                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index
                           + 1]._M_data)((anon_class_8_1_a78179b7_conflict *)&local_258,&local_170);
                        pIVar20[1].super_Displayable._vptr_Displayable = DVar6._vptr_Displayable;
                        *(undefined2 *)((long)&pIVar20[2].super_Displayable._vptr_Displayable + 1) =
                             local_170.super__Variant_base<int,_mir::inst::VarId>.
                             super__Move_assign_alias<int,_mir::inst::VarId>.
                             super__Copy_assign_alias<int,_mir::inst::VarId>.
                             super__Move_ctor_alias<int,_mir::inst::VarId>.
                             super__Copy_ctor_alias<int,_mir::inst::VarId>.
                             super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
                        pIVar24 = (puVar17->_M_t).
                                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                        (puVar17->_M_t).
                        super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = pIVar20;
                        ppVar27 = local_d0;
                      }
                      else {
                        pmVar19 = std::
                                  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  ::at(local_120,&(pIVar24->dest).id);
                        if (pmVar19->is_phi_var == false) {
                          local_90.super_Displayable._vptr_Displayable =
                               (_func_int **)&PTR_display_001ee058;
                          local_90.id = (pIVar24->dest).id;
                          local_a0.super_Displayable._vptr_Displayable =
                               (_func_int **)&PTR_display_001ee058;
                          local_a0.id = local_1b8;
                          var_replace::Var_Replace::replace
                                    ((Var_Replace *)local_238,&local_90,&local_a0);
                          pIVar21 = (Inst *)operator_new(0x38);
                          (pIVar21->dest).super_Displayable._vptr_Displayable =
                               (_func_int **)&PTR_display_001ee058;
                          (pIVar21->dest).id = local_1b8;
                          (pIVar21->super_Displayable)._vptr_Displayable =
                               local_1a0._vptr_Displayable;
                          *(undefined1 *)&pIVar21[2].super_Displayable._vptr_Displayable = 1;
                          pIVar21[1].dest.super_Displayable._vptr_Displayable =
                               (_func_int **)&PTR_display_001ee058;
                          pIVar21[1].dest.id = local_1b8;
                          pIVar21[1].super_Displayable._vptr_Displayable =
                               local_1d0._vptr_Displayable;
                          *(undefined2 *)((long)&pIVar21[2].super_Displayable._vptr_Displayable + 1)
                               = 1;
                          pIVar20 = (puVar17->_M_t).
                                    super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                          (puVar17->_M_t).
                          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = pIVar21;
                          if (pIVar20 != (Inst *)0x0) {
                            (*(pIVar20->super_Displayable)._vptr_Displayable[5])();
                          }
                          pmVar22 = std::
                                    map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                                    ::at((map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                                          *)&local_200,&pIVar24->dest);
                          pair.first = pmVar22->first;
                          pair.second = pmVar22->second;
                          puVar17 = var_replace::Var_Replace::get_usepoint
                                              ((Var_Replace *)local_238,pair);
LAB_00159732:
                          (((puVar17->_M_t).
                            super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                            .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest).id
                               = local_1b8;
                          goto LAB_0015973f;
                        }
                        pIVar20 = (Inst *)operator_new(0x38);
                        uVar3 = (pIVar24->dest).id;
                        (pIVar20->dest).super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001ee058;
                        (pIVar20->dest).id = uVar3;
                        (pIVar20->super_Displayable)._vptr_Displayable = local_1a0._vptr_Displayable
                        ;
                        *(undefined1 *)&pIVar20[2].super_Displayable._vptr_Displayable = 1;
                        pIVar20[1].dest.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001ee058;
                        pIVar20[1].dest.id = local_1b8;
                        pIVar20[1].super_Displayable._vptr_Displayable = local_1d0._vptr_Displayable
                        ;
                        *(undefined2 *)((long)&pIVar20[2].super_Displayable._vptr_Displayable + 1) =
                             1;
                        pIVar24 = (puVar17->_M_t).
                                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                        (puVar17->_M_t).
                        super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = pIVar20;
                      }
                      if (pIVar24 != (Inst *)0x0) {
                        (*(pIVar24->super_Displayable)._vptr_Displayable[5])();
                      }
                    }
LAB_0015973f:
                    ppVar26 = ppVar26 + 1;
                  } while (ppVar26 != ppVar27);
                }
                std::
                _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                             *)&local_200);
                std::
                _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                             *)&_Stack_230);
                p_Var9 = local_d8;
                goto LAB_00159775;
              }
              iVar7 = pthread_mutex_lock((pthread_mutex_t *)(lVar14 + 0x148));
              if (iVar7 == 0) {
                *(bool *)(lVar14 + 0x120) = local_b8.is_null_;
                ((duration *)(lVar14 + 0x118))->__r = (rep)local_b8.time_point.__d.__r;
                pthread_mutex_unlock((pthread_mutex_t *)(lVar14 + 0x148));
                goto LAB_00159006;
              }
              iVar7 = std::__throw_system_error(iVar7);
LAB_001597d4:
              iVar7 = std::__throw_system_error(iVar7);
            }
            else {
              iVar7 = pthread_mutex_lock((pthread_mutex_t *)(lVar14 + 0x148));
              if (iVar7 == 0) {
                std::__cxx11::string::_M_assign((string *)(lVar14 + 0x90));
                *(undefined1 *)(lVar14 + 0xb0) = local_150;
                pthread_mutex_unlock((pthread_mutex_t *)(lVar14 + 0x148));
                goto LAB_00158ea2;
              }
            }
            iVar7 = std::__throw_system_error(iVar7);
LAB_001597e2:
            uVar23 = std::__throw_system_error(iVar7);
            if (local_238 != (undefined1  [8])local_238) {
              operator_delete((void *)local_238,local_228._0_8_ + 1);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&local_60);
            _Unwind_Resume(uVar23);
          }
LAB_00159775:
          if (local_140 != local_130) {
            operator_delete(local_140,local_130[0] + 1);
          }
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != &local_60._M_impl.super__Rb_tree_header);
      }
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void Global_Var_to_Local::optimize_mir(
    mir::inst::MirPackage& mir,
    std::map<std::string, std::any>& extra_data_repo) {
  std::set<std::string> global_vars;
  for (auto& p : mir.global_values) {
    if (p.second.index() == 0) {
      global_vars.insert(p.first);
    }
  }
  for (auto& f : mir.functions) {
    if (f.second.type->is_extern || f.first == "$$5_main" || f.first == "main")
      continue;
    optimize_func(f.second, global_vars);
  }
  if (!mir.functions.count("$$5_main")) {
    return;
  }
  auto& f = mir.functions.at("$$5_main");
  if (!f.basic_blks.size()) {
    return;
  }
  auto& startblk = f.basic_blks.begin()->second;
  mir::inst::VarId dest;
  for (auto s : global_vars) {
    int idx = 0;
    for (; idx < startblk.inst.size(); idx++) {
      auto& inst = startblk.inst.at(idx);
      auto& i = *inst;
      if (inst->inst_kind() == mir::inst::InstKind::Ref) {
        auto ref = dynamic_cast<mir::inst::RefInst*>(&i);
        if (ref->val.index() == 1 && std::get<std::string>(ref->val) == s) {
          dest = ref->dest;
          break;
        }
      }
    }
    if (idx == startblk.inst.size()) {
      continue;
    }
    auto var = get_new_id(f, mir::inst::Variable(mir::types::new_int_ty()));
    LOG(TRACE) << "convert global var  " << s << " to local var " << var
               << " in " << f.name << std::endl;
    startblk.inst.insert(startblk.inst.begin() + idx + 1,
                         std::make_unique<mir::inst::LoadInst>(dest, var));
    var_replace::Var_Replace vp(f);
    for (auto& usepoint : vp.usepoints.at(dest)) {
      if (usepoint.first == startblk.id && usepoint.second == idx + 1) {
        continue;
      }
      auto& inst = vp.get_usepoint(usepoint);
      if (inst->inst_kind() == mir::inst::InstKind::Store) {
        auto& i = *inst;
        auto ist = dynamic_cast<mir::inst::StoreOffsetInst*>(&i);
        if (!ist->val.is_immediate() &&
            !f.variables.at(std::get<mir::inst::VarId>(ist->val).id)
                 .is_phi_var) {
          auto val = std::get<mir::inst::VarId>(ist->val);
          vp.replace(val, var);
          inst = std::make_unique<mir::inst::AssignInst>(var, var);
          auto& def = vp.get_usepoint(vp.defpoint.at(val));
          def->dest = var;
        } else {
          inst = std::make_unique<mir::inst::AssignInst>(var, ist->val);
        }
      } else {
        auto& i = *inst;
        auto ist = dynamic_cast<mir::inst::LoadOffsetInst*>(&i);
        if (!f.variables.at(ist->dest.id).is_phi_var) {
          vp.replace(ist->dest, var);
          inst = std::make_unique<mir::inst::AssignInst>(var, var);
          auto& def = vp.get_usepoint(vp.defpoint.at(ist->dest));
          def->dest = var;
        } else {
          inst = std::make_unique<mir::inst::AssignInst>(ist->dest, var);
        }
      }
    }
  }
}